

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float __thiscall
ImGuiMenuColumns::DeclColumns
          (ImGuiMenuColumns *this,float w_icon,float w_label,float w_shortcut,float w_mark)

{
  unsigned_short uVar1;
  uint uVar2;
  float w_mark_local;
  float w_shortcut_local;
  float w_label_local;
  float w_icon_local;
  ImGuiMenuColumns *this_local;
  
  uVar1 = ImMax<unsigned_short>(this->Widths[0],(unsigned_short)(int)w_icon);
  this->Widths[0] = uVar1;
  uVar1 = ImMax<unsigned_short>(this->Widths[1],(unsigned_short)(int)w_label);
  this->Widths[1] = uVar1;
  uVar1 = ImMax<unsigned_short>(this->Widths[2],(unsigned_short)(int)w_shortcut);
  this->Widths[2] = uVar1;
  uVar1 = ImMax<unsigned_short>(this->Widths[3],(unsigned_short)(int)w_mark);
  this->Widths[3] = uVar1;
  CalcNextTotalWidth(this,false);
  uVar2 = ImMax<unsigned_int>(this->TotalWidth,this->NextTotalWidth);
  return (float)uVar2;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w_icon, float w_label, float w_shortcut, float w_mark)
{
    Widths[0] = ImMax(Widths[0], (ImU16)w_icon);
    Widths[1] = ImMax(Widths[1], (ImU16)w_label);
    Widths[2] = ImMax(Widths[2], (ImU16)w_shortcut);
    Widths[3] = ImMax(Widths[3], (ImU16)w_mark);
    CalcNextTotalWidth(false);
    return (float)ImMax(TotalWidth, NextTotalWidth);
}